

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spline.cpp
# Opt level: O1

VectorNd __thiscall HermiteSpline<5U,_2U>::interpolate(HermiteSpline<5U,_2U> *this,double s)

{
  double dVar1;
  VectorNd *p;
  long lVar2;
  long lVar3;
  long *in_RSI;
  long lVar4;
  bool bVar5;
  double s_;
  double dVar6;
  double dVar7;
  VectorNd VVar8;
  
  lVar2 = *in_RSI;
  dVar1 = *(double *)(lVar2 + 0x60);
  if (dVar1 < s && in_RSI[1] != lVar2) {
    do {
      s = s - dVar1;
      if (s <= dVar1) break;
    } while (in_RSI[1] != lVar2);
  }
  dVar6 = 1.0;
  if (s <= 1.0) {
    dVar6 = s;
  }
  lVar3 = 0;
  do {
    VVar8.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0] =
         (pointer)0x0;
    lVar4 = 0;
    dVar7 = 1.0;
    do {
      VVar8.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0] =
           (pointer)((double)VVar8.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.
                             m_storage.m_data.array[0] + dVar7 * *(double *)(lVar2 + lVar4 * 8));
      lVar4 = lVar4 + 1;
      dVar7 = (dVar6 / dVar1) * dVar7;
    } while (lVar4 != 6);
    (&(this->children).
      super__Vector_base<UnitBoundedPolynomial<5U,_2U>,_std::allocator<UnitBoundedPolynomial<5U,_2U>_>_>
      ._M_impl.super__Vector_impl_data._M_start)[lVar3] =
         VVar8.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array
         [0];
    lVar2 = lVar2 + 0x30;
    bVar5 = lVar3 == 0;
    lVar3 = lVar3 + 1;
  } while (bVar5);
  VVar8.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1] = 1.0
  ;
  return (VectorNd)
         VVar8.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array;
}

Assistant:

typename HermiteSpline<Order, Dims>::VectorNd HermiteSpline<Order, Dims>::interpolate(double s)
{
    int m = 0;
    double s_ = s;

    while (s_ > children[m].length && m < children.size())
    {
        s_ -= children[m].length;
    }

    if (s_ >= 1.0)
    {
        s_ = 1.0;
    }

    return children[m].interpolate(s_ / children[m].length);
}